

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O3

void __thiscall
WriterTestHelper<unsigned_char,_3U,_32849U>::~WriterTestHelper
          (WriterTestHelper<unsigned_char,_3U,_32849U> *this)

{
  pointer pwVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  ktxHashList_Destruct(&this->kvHash);
  ktxHashList_Destruct(&this->kvHash_ktx2);
  pwVar1 = (this->imageList).super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pwVar1 != (pointer)0x0) {
    operator_delete(pwVar1,(long)(this->imageList).
                                 super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pwVar1);
  }
  std::
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ::~vector(&this->images);
  pcVar2 = (this->comparisonWriter_ktx2)._M_dataplus._M_p;
  paVar3 = &(this->comparisonWriter_ktx2).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->writer_ktx2)._M_dataplus._M_p;
  paVar3 = &(this->writer_ktx2).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~WriterTestHelper() {
        ktxHashList_Destruct(&kvHash);
        ktxHashList_Destruct(&kvHash_ktx2);
    }